

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqldatabase.cpp
# Opt level: O2

QSqlDatabase __thiscall
QSqlDatabasePrivate::database(QSqlDatabasePrivate *this,QString *name,bool open)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  Type *key;
  long lVar4;
  long lVar5;
  QDebug *this_00;
  int __oflag;
  QSqlDatabasePrivate *this_01;
  long in_FS_OFFSET;
  QSqlDatabase db;
  QSqlError QStack_88;
  QArrayDataPointer<char16_t> local_80;
  QDebug local_68;
  undefined1 local_60 [28];
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = this;
  cVar1 = QCoreApplication::instanceExists();
  if (cVar1 == '\0') {
    lcSqlDb();
    if (((byte)lcSqlDb::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      local_60._8_4_ = 2;
      local_60._12_8_ = 0;
      local_60._20_8_ = 0;
      local_44 = 0;
      local_40 = lcSqlDb::category.name;
      QMessageLogger::warning(local_60 + 8,"QSqlDatabase requires a QCoreApplication");
    }
    QSqlDatabase::QSqlDatabase((QSqlDatabase *)this);
    goto LAB_00118c8a;
  }
  local_60._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  key = QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_s_sqlGlobals>_>
        ::operator()((QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_s_sqlGlobals>_>
                      *)this_01);
  anon_unknown.dwarf_445a7::QtSqlGlobals::connection((QtSqlGlobals *)local_60,(QString *)key);
  bVar2 = QSqlDatabase::isValid((QSqlDatabase *)local_60);
  if (bVar2) {
    lVar4 = QObject::thread();
    lVar5 = QThread::currentThread();
    if (lVar4 == lVar5) {
      if (open) {
        cVar1 = (**(code **)(**(long **)(local_60._0_8_ + 8) + 0x60))();
        if (cVar1 == '\0') {
          iVar3 = QSqlDatabase::open((QSqlDatabase *)local_60,(char *)key,__oflag);
          if ((char)iVar3 == '\0') {
            lcSqlDb();
            if (((byte)lcSqlDb::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) !=
                0) {
              local_60._8_4_ = 2;
              local_60._12_8_ = 0;
              local_60._20_8_ = 0;
              local_44 = 0;
              local_40 = lcSqlDb::category.name;
              QMessageLogger::warning();
              this_00 = QDebug::operator<<(&local_68,
                                           "QSqlDatabasePrivate::database: unable to open database:"
                                          );
              QSqlDatabase::lastError((QSqlDatabase *)&QStack_88);
              QSqlError::text((QString *)&local_80,&QStack_88);
              QDebug::operator<<(this_00,(QString *)&local_80);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
              QSqlError::~QSqlError(&QStack_88);
              QDebug::~QDebug(&local_68);
            }
          }
        }
      }
      goto LAB_00118c73;
    }
    lcSqlDb();
    if (((byte)lcSqlDb::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      local_60._8_4_ = 2;
      local_60._12_8_ = 0;
      local_60._20_8_ = 0;
      local_44 = 0;
      local_40 = lcSqlDb::category.name;
      QMessageLogger::warning
                (local_60 + 8,
                 "QSqlDatabasePrivate::database: requested database does not belong to the calling thread."
                );
    }
    QSqlDatabase::QSqlDatabase((QSqlDatabase *)this);
  }
  else {
LAB_00118c73:
    QSqlDatabase::QSqlDatabase((QSqlDatabase *)this,(QSqlDatabase *)local_60);
  }
  QSqlDatabase::~QSqlDatabase((QSqlDatabase *)local_60);
LAB_00118c8a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSqlDatabase)this;
  }
  __stack_chk_fail();
}

Assistant:

QSqlDatabase QSqlDatabasePrivate::database(const QString& name, bool open)
{
    CHECK_QCOREAPPLICATION_RETVAL
    QSqlDatabase db = s_sqlGlobals()->connection(name);
    if (!db.isValid())
        return db;
    if (db.driver()->thread() != QThread::currentThread()) {
        qCWarning(lcSqlDb, "QSqlDatabasePrivate::database: requested database does not belong to the calling thread.");
        return QSqlDatabase();
    }

    if (open && !db.isOpen()) {
        if (!db.open())
            qCWarning(lcSqlDb) << "QSqlDatabasePrivate::database: unable to open database:" << db.lastError().text();

    }
    return db;
}